

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O0

void __thiscall
headers_sync_chainwork_tests::headers_sync_state::test_method(headers_sync_state *this)

{
  __normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_> __x;
  __normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  __x_00;
  initializer_list<CBlockHeader> __l;
  initializer_list<CBlockHeader> __l_00;
  __normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  __last;
  __normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  __last_00;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar1;
  CBlock *pCVar2;
  reference pvVar3;
  iterator received_headers;
  long in_FS_OFFSET;
  CBlockIndex *chain_start;
  int target_blocks;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> headers_batch;
  unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> hss;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> second_chain;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> first_chain;
  ProcessingResult result;
  arith_uint256 chain_work;
  CChainParams *in_stack_fffffffffffff1a8;
  CChainParams *pCVar4;
  uint32_t uVar5;
  undefined4 in_stack_fffffffffffff1b4;
  int in_stack_fffffffffffff1b8;
  int in_stack_fffffffffffff1bc;
  undefined7 in_stack_fffffffffffff1c0;
  undefined1 in_stack_fffffffffffff1c7;
  CBlockHeader *in_stack_fffffffffffff1c8;
  const_string *in_stack_fffffffffffff1d0;
  const_string *msg;
  undefined7 in_stack_fffffffffffff1d8;
  undefined1 in_stack_fffffffffffff1df;
  lazy_ostream *in_stack_fffffffffffff1e0;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffff1e8;
  const_string *this_00;
  undefined7 in_stack_fffffffffffff1f0;
  undefined1 in_stack_fffffffffffff1f7;
  size_type in_stack_fffffffffffff1f8;
  undefined7 in_stack_fffffffffffff208;
  undefined1 in_stack_fffffffffffff20f;
  __normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff218;
  undefined4 in_stack_fffffffffffff21c;
  undefined8 in_stack_fffffffffffff220;
  undefined1 full_headers_message;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffff228;
  HeadersSyncState *in_stack_fffffffffffff230;
  HeadersSyncState *this_01;
  uint32_t in_stack_fffffffffffff238;
  arith_uint256 *in_stack_fffffffffffff258;
  CBlockIndex *in_stack_fffffffffffff260;
  Params *in_stack_fffffffffffff268;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  HeadersSyncState *in_stack_fffffffffffff278;
  const_string local_aa0 [2];
  lazy_ostream local_a80 [2];
  assertion_result local_a60 [2];
  const_string local_a28 [2];
  lazy_ostream local_a08 [2];
  assertion_result local_9e8 [2];
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [2];
  assertion_result local_8f8 [2];
  CBlockHeader *local_8c0;
  const_string local_8b0 [2];
  lazy_ostream local_890 [2];
  assertion_result local_870 [3];
  const_string local_818 [2];
  lazy_ostream local_7f8 [2];
  assertion_result local_7d8 [2];
  const_string local_7a0 [2];
  lazy_ostream local_780 [2];
  assertion_result local_760 [2];
  const_string local_728 [2];
  lazy_ostream local_708 [2];
  assertion_result local_6e8 [2];
  const_string local_6b0 [2];
  lazy_ostream local_690 [2];
  assertion_result local_670 [2];
  const_string local_638 [2];
  lazy_ostream local_618 [2];
  assertion_result local_5f8 [2];
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  assertion_result local_508 [2];
  const_string local_4d0 [2];
  lazy_ostream local_4b0 [2];
  assertion_result local_490 [2];
  const_string local_458 [2];
  lazy_ostream local_438 [2];
  assertion_result local_418 [2];
  const_string local_3e0 [2];
  lazy_ostream local_3c0 [2];
  assertion_result local_3a0 [2];
  const_string local_368 [2];
  lazy_ostream local_348 [2];
  assertion_result local_328 [3];
  CBlockHeader *local_2d0;
  HeadersSyncState local_2c0;
  undefined1 local_c8 [192];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1a8);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1a8);
  std::unique_ptr<HeadersSyncState,std::default_delete<HeadersSyncState>>::
  unique_ptr<std::default_delete<HeadersSyncState>,void>
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
             in_stack_fffffffffffff1a8);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffff1a8,0x6a5f68);
  Params();
  CChainParams::GenesisBlock(in_stack_fffffffffffff1a8);
  CBlockHeader::GetHash(in_stack_fffffffffffff1c8);
  Params();
  CChainParams::GenesisBlock(in_stack_fffffffffffff1a8);
  Params();
  CChainParams::GenesisBlock(in_stack_fffffffffffff1a8);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffff1a8,0x6a6027);
  ArithToUint256((arith_uint256 *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  Params();
  CChainParams::GenesisBlock(in_stack_fffffffffffff1a8);
  pCVar4 = (CChainParams *)(local_c8 + 0x60);
  HeadersGeneratorSetup::GenerateHeaders
            ((HeadersGeneratorSetup *)CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1d0,
             (size_t)in_stack_fffffffffffff1c8,
             (uint256 *)CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0),
             in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8,
             (uint256 *)in_stack_fffffffffffff230,in_stack_fffffffffffff238);
  Params();
  CChainParams::GenesisBlock(pCVar4);
  CBlockHeader::GetHash(in_stack_fffffffffffff1c8);
  Params();
  CChainParams::GenesisBlock(pCVar4);
  Params();
  CChainParams::GenesisBlock(pCVar4);
  arith_uint256::arith_uint256((arith_uint256 *)pCVar4,0x6a6174);
  ArithToUint256((arith_uint256 *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  Params();
  pCVar2 = CChainParams::GenesisBlock(pCVar4);
  uVar5 = (pCVar2->super_CBlockHeader).nBits;
  pCVar4 = (CChainParams *)local_c8;
  HeadersGeneratorSetup::GenerateHeaders
            ((HeadersGeneratorSetup *)CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1d0,
             (size_t)in_stack_fffffffffffff1c8,
             (uint256 *)CONCAT17(in_stack_fffffffffffff1c7,in_stack_fffffffffffff1c0),
             in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8,
             (uint256 *)in_stack_fffffffffffff230,in_stack_fffffffffffff238);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pCVar4);
  test_method::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)
             CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)pCVar4);
  local_2d0 = (CBlockHeader *)
              std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
                        ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                         CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __gnu_cxx::
  __normal_iterator<CBlockHeader_const*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>::
  __normal_iterator<CBlockHeader*>
            ((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
              *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             (__normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
              *)CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::begin
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __x._M_current._4_4_ = in_stack_fffffffffffff1b4;
  __x._M_current._0_4_ = uVar5;
  std::
  next<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>>
            (__x,(difference_type)pCVar4);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __position._M_current._4_4_ = in_stack_fffffffffffff21c;
  __position._M_current._0_4_ = in_stack_fffffffffffff218;
  __last._M_current._7_1_ = in_stack_fffffffffffff20f;
  __last._M_current._0_7_ = in_stack_fffffffffffff208;
  std::vector<CBlockHeader,std::allocator<CBlockHeader>>::
  insert<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>,void>
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1d0,
             __position,in_stack_fffffffffffff210,__last);
  operator_new(0x1e8);
  Params();
  CChainParams::GetConsensus(pCVar4);
  HeadersSyncState::HeadersSyncState
            (in_stack_fffffffffffff278,CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270)
             ,in_stack_fffffffffffff268,in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4,
             (pointer)0x6a639e);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  pvVar3 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::front
                     ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                      CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  local_2c0.m_redownload_chain_work.super_base_uint<256U>.pn._8_8_ =
       *(undefined8 *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_2c0.m_redownload_chain_work.super_base_uint<256U>.pn[4] = pvVar3->nBits;
  local_2c0.m_redownload_chain_work.super_base_uint<256U>.pn[5] = pvVar3->nNonce;
  local_2c0.m_redownload_buffer_last_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)pvVar3;
  local_2c0.m_redownload_buffer_last_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
  local_2c0.m_redownload_buffer_last_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0xc);
  local_2c0.m_redownload_buffer_first_prev_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_2c0.m_redownload_buffer_first_prev_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_2c0.m_redownload_buffer_first_prev_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4);
  local_2c0.m_redownload_buffer_first_prev_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc);
  local_2c0.m_redownload_chain_work.super_base_uint<256U>.pn._0_8_ =
       *(undefined8 *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14);
  std::allocator<CBlockHeader>::allocator((allocator<CBlockHeader> *)pCVar4);
  __l._M_array._7_1_ = in_stack_fffffffffffff1f7;
  __l._M_array._0_7_ = in_stack_fffffffffffff1f0;
  __l._M_len = in_stack_fffffffffffff1f8;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            (in_stack_fffffffffffff1e8,__l,(allocator_type *)in_stack_fffffffffffff1e0);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  std::allocator<CBlockHeader>::~allocator((allocator<CBlockHeader> *)pCVar4);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_328,local_348,local_368,0x66,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a0,local_3c0,local_3e0,0x67,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_418,local_438,local_458,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  HeadersSyncState::ProcessingResult::operator=
            ((ProcessingResult *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             (ProcessingResult *)CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_490,local_4b0,local_4d0,0x6c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_508,local_528,local_548,0x6d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  operator_new(0x1e8);
  Params();
  CChainParams::GetConsensus(pCVar4);
  HeadersSyncState::HeadersSyncState
            (in_stack_fffffffffffff278,CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270)
             ,in_stack_fffffffffffff268,in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4,
             (pointer)0x6a6c72);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_580,local_5a0,local_5c0,0x72,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  HeadersSyncState::ProcessingResult::operator=
            ((ProcessingResult *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             (ProcessingResult *)CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5f8,local_618,local_638,0x75,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_670,local_690,local_6b0,0x76,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
              ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)pCVar4);
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
              ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6e8,local_708,local_728,0x78,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_760,local_780,local_7a0,0x7a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  operator_new(0x1e8);
  Params();
  CChainParams::GetConsensus(pCVar4);
  HeadersSyncState::HeadersSyncState
            (in_stack_fffffffffffff278,CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270)
             ,in_stack_fffffffffffff268,in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4,
             (pointer)0x6a7474);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7d8,local_7f8,local_818,0x7f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  pvVar3 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::front
                     ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                      CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  local_2c0.m_redownload_buffer_last_height =
       *(int64_t *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_2c0.m_redownload_buffer_last_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)&pvVar3->nBits;
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = *(_Elt_pointer *)pvVar3;
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       *(_Elt_pointer *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_last =
       *(_Elt_pointer *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0xc);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_node =
       *(_Map_pointer *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur =
       *(_Elt_pointer *)((pvVar3->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first =
       *(_Elt_pointer *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last =
       *(_Elt_pointer *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc);
  local_2c0.m_redownloaded_headers.
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       *(_Map_pointer *)((pvVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14);
  std::allocator<CBlockHeader>::allocator((allocator<CBlockHeader> *)pCVar4);
  __l_00._M_array._7_1_ = in_stack_fffffffffffff1f7;
  __l_00._M_array._0_7_ = in_stack_fffffffffffff1f0;
  __l_00._M_len = in_stack_fffffffffffff1f8;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            (in_stack_fffffffffffff1e8,__l_00,(allocator_type *)in_stack_fffffffffffff1e0);
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             SUB81((ulong)in_stack_fffffffffffff220 >> 0x38,0));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  std::allocator<CBlockHeader>::~allocator((allocator<CBlockHeader> *)pCVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_870,local_890,local_8b0,0x82,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    full_headers_message = (undefined1)((ulong)in_stack_fffffffffffff220 >> 0x38);
  } while (bVar1);
  this_01 = &local_2c0;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::clear
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)pCVar4);
  local_8c0 = (CBlockHeader *)
              std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
                        ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                         CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __gnu_cxx::
  __normal_iterator<CBlockHeader_const*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>::
  __normal_iterator<CBlockHeader*>
            ((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
              *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             (__normal_iterator<CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
              *)CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::begin
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __x_00._M_current._4_4_ = in_stack_fffffffffffff1b4;
  __x_00._M_current._0_4_ = uVar5;
  std::
  next<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>>
            (__x_00,(difference_type)pCVar4);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  __position_00._M_current._4_4_ = in_stack_fffffffffffff21c;
  __position_00._M_current._0_4_ = in_stack_fffffffffffff218;
  __last_00._M_current._7_1_ = in_stack_fffffffffffff20f;
  __last_00._M_current._0_7_ = in_stack_fffffffffffff208;
  received_headers =
       std::vector<CBlockHeader,std::allocator<CBlockHeader>>::
       insert<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>,void>
                 ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffff1d0,
                  __position_00,in_stack_fffffffffffff210,__last_00);
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
  HeadersSyncState::ProcessNextHeaders
            (this_01,(vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                     received_headers._M_current,(bool)full_headers_message);
  HeadersSyncState::ProcessingResult::operator=
            ((ProcessingResult *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             (ProcessingResult *)CONCAT44(in_stack_fffffffffffff1b4,uVar5));
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)pCVar4);
    HeadersSyncState::GetState((HeadersSyncState *)pCVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f8,local_918,local_938,0x8a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::empty
              ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_990,local_9b0,0x8b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
               in_stack_fffffffffffff1d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    in_stack_fffffffffffff1e0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a08,local_a28,0x8c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    in_stack_fffffffffffff1df = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1df);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff1e0,
               CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),msg);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               SUB41((uint)in_stack_fffffffffffff1b4 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff1b4,uVar5),
               (basic_cstring<const_char> *)pCVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (pointer)CONCAT44(in_stack_fffffffffffff1b4,uVar5),(unsigned_long)pCVar4);
    pCVar4 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a60,local_a80,local_aa0,0x8f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  HeadersSyncState::ProcessingResult::~ProcessingResult((ProcessingResult *)pCVar4);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::~unique_ptr
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(headers_sync_state)
{
    std::vector<CBlockHeader> first_chain;
    std::vector<CBlockHeader> second_chain;

    std::unique_ptr<HeadersSyncState> hss;

    const int target_blocks = 15000;
    arith_uint256 chain_work = target_blocks*2;

    // Generate headers for two different chains (using differing merkle roots
    // to ensure the headers are different).
    GenerateHeaders(first_chain, target_blocks-1, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(0), Params().GenesisBlock().nBits);

    GenerateHeaders(second_chain, target_blocks-2, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(1), Params().GenesisBlock().nBits);

    const CBlockIndex* chain_start = WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(Params().GenesisBlock().GetHash()));
    std::vector<CBlockHeader> headers_batch;

    // Feed the first chain to HeadersSyncState, by delivering 1 header
    // initially and then the rest.
    headers_batch.insert(headers_batch.end(), std::next(first_chain.begin()), first_chain.end());

    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders({first_chain.front()}, true);
    // Pretend the first header is still "full", so we don't abort.
    auto result = hss->ProcessNextHeaders(headers_batch, true);

    // This chain should look valid, and we should have met the proof-of-work
    // requirement.
    BOOST_CHECK(result.success);
    BOOST_CHECK(result.request_more);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    // Try to sneakily feed back the second chain.
    result = hss->ProcessNextHeaders(second_chain, true);
    BOOST_CHECK(!result.success); // foiled!
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Now try again, this time feeding the first chain twice.
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    result = hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(result.success);
    BOOST_CHECK(!result.request_more);
    // All headers should be ready for acceptance:
    BOOST_CHECK(result.pow_validated_headers.size() == first_chain.size());
    // Nothing left for the sync logic to do:
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Finally, verify that just trying to process the second chain would not
    // succeed (too little work)
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);
     // Pretend just the first message is "full", so we don't abort.
    (void)hss->ProcessNextHeaders({second_chain.front()}, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);

    headers_batch.clear();
    headers_batch.insert(headers_batch.end(), std::next(second_chain.begin(), 1), second_chain.end());
    // Tell the sync logic that the headers message was not full, implying no
    // more headers can be requested. For a low-work-chain, this should causes
    // the sync to end with no headers for acceptance.
    result = hss->ProcessNextHeaders(headers_batch, false);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);
    BOOST_CHECK(result.pow_validated_headers.empty());
    BOOST_CHECK(!result.request_more);
    // Nevertheless, no validation errors should have been detected with the
    // chain:
    BOOST_CHECK(result.success);
}